

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinusoidal_linear_chirp_source.cc
# Opt level: O1

void __thiscall
webrtc::SinusoidalLinearChirpSource::Run
          (SinusoidalLinearChirpSource *this,size_t frames,float *destination)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  
  if (frames != 0) {
    sVar1 = 0;
    do {
      dVar3 = ((double)CONCAT44(0x45300000,(int)(this->current_index_ >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this->current_index_) - 4503599627370496.0);
      dVar2 = dVar3 - this->delay_samples_;
      fVar4 = 0.0;
      if ((((this->max_frequency_ + -5.0) * dVar2) /
           (((double)CONCAT44(0x45300000,(int)(this->total_samples_ >> 0x20)) -
            1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)this->total_samples_) - 4503599627370496.0)) + 5.0 <=
           (double)this->sample_rate_ * 0.5) && (this->delay_samples_ <= dVar3)) {
        dVar2 = dVar2 / (double)this->sample_rate_;
        dVar2 = sin((dVar2 * 5.0 + this->k_ * 0.5 * dVar2 * dVar2) * 6.283185307179586);
        fVar4 = (float)dVar2;
      }
      destination[sVar1] = fVar4;
      sVar1 = sVar1 + 1;
      this->current_index_ = this->current_index_ + 1;
    } while (frames != sVar1);
  }
  return;
}

Assistant:

void SinusoidalLinearChirpSource::Run(size_t frames, float* destination) {
  for (size_t i = 0; i < frames; ++i, ++current_index_) {
    // Filter out frequencies higher than Nyquist.
    if (Frequency(current_index_) > 0.5 * sample_rate_) {
      destination[i] = 0;
    } else {
      // Calculate time in seconds.
      if (current_index_ < delay_samples_) {
        destination[i] = 0;
      } else {
        // Sinusoidal linear chirp.
        double t = (current_index_ - delay_samples_) / sample_rate_;
        destination[i] =
            sin(2 * M_PI * (kMinFrequency * t + (k_ / 2) * t * t));
      }
    }
  }
}